

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

bool absl::anon_unknown_0::ConsumeDurationUnit(char **start,char *end,Duration *unit)

{
  char cVar1;
  Duration DVar2;
  size_t size;
  Duration *unit_local;
  char *end_local;
  char **start_local;
  
  if (end == *start) {
    return false;
  }
  if ((long)end - (long)*start != 1) {
    cVar1 = **start;
    if (cVar1 == 'm') {
      if ((*start)[1] == 's') {
        *start = *start + 2;
        DVar2 = Milliseconds<int,_0>(1);
        unit->rep_hi_ = DVar2.rep_hi_;
        unit->rep_lo_ = DVar2.rep_lo_;
        return true;
      }
    }
    else if (cVar1 == 'n') {
      if ((*start)[1] == 's') {
        *start = *start + 2;
        DVar2 = Nanoseconds<int,_0>(1);
        unit->rep_hi_ = DVar2.rep_hi_;
        unit->rep_lo_ = DVar2.rep_lo_;
        return true;
      }
    }
    else if ((cVar1 == 'u') && ((*start)[1] == 's')) {
      *start = *start + 2;
      DVar2 = Microseconds<int,_0>(1);
      unit->rep_hi_ = DVar2.rep_hi_;
      unit->rep_lo_ = DVar2.rep_lo_;
      return true;
    }
  }
  cVar1 = **start;
  if (cVar1 == 'h') {
    DVar2 = Hours<int,_0>(1);
    unit->rep_hi_ = DVar2.rep_hi_;
    unit->rep_lo_ = DVar2.rep_lo_;
    *start = *start + 1;
    start_local._7_1_ = true;
  }
  else if (cVar1 == 'm') {
    DVar2 = Minutes<int,_0>(1);
    unit->rep_hi_ = DVar2.rep_hi_;
    unit->rep_lo_ = DVar2.rep_lo_;
    *start = *start + 1;
    start_local._7_1_ = true;
  }
  else if (cVar1 == 's') {
    DVar2 = Seconds<int,_0>(1);
    unit->rep_hi_ = DVar2.rep_hi_;
    unit->rep_lo_ = DVar2.rep_lo_;
    *start = *start + 1;
    start_local._7_1_ = true;
  }
  else {
    start_local._7_1_ = false;
  }
  return start_local._7_1_;
}

Assistant:

bool ConsumeDurationUnit(const char** start, const char* end, Duration* unit) {
  size_t size = end - *start;
  switch (size) {
    case 0:
      return false;
    default:
      switch (**start) {
        case 'n':
          if (*(*start + 1) == 's') {
            *start += 2;
            *unit = Nanoseconds(1);
            return true;
          }
          break;
        case 'u':
          if (*(*start + 1) == 's') {
            *start += 2;
            *unit = Microseconds(1);
            return true;
          }
          break;
        case 'm':
          if (*(*start + 1) == 's') {
            *start += 2;
            *unit = Milliseconds(1);
            return true;
          }
          break;
        default:
          break;
      }
      ABSL_FALLTHROUGH_INTENDED;
    case 1:
      switch (**start) {
        case 's':
          *unit = Seconds(1);
          *start += 1;
          return true;
        case 'm':
          *unit = Minutes(1);
          *start += 1;
          return true;
        case 'h':
          *unit = Hours(1);
          *start += 1;
          return true;
        default:
          return false;
      }
  }
}